

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O1

void __thiscall
luna::SemanticAnalysisVisitor::Visit(SemanticAnalysisVisitor *this,Terminator *term,void *data)

{
  SemanticOp SVar1;
  int iVar2;
  LexicalScoping LVar3;
  SemanticException *this_00;
  undefined4 uVar4;
  
  SVar1 = *data;
  term->semantic_ = SVar1;
  iVar2 = (term->token_).token_;
  if (SVar1 != SemanticOp_Read && iVar2 != 0x115) {
    __assert_fail("exp_var_data->semantic_op_ == SemanticOp_Read",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                  ,0x1ce,"virtual void luna::SemanticAnalysisVisitor::Visit(Terminator *, void *)");
  }
  switch(iVar2) {
  case 0x112:
switchD_001313c3_caseD_112:
    uVar4 = 2;
    break;
  case 0x113:
  case 0x114:
  case 0x118:
  case 0x119:
  case 0x11a:
  case 0x11b:
  case 0x11c:
    goto switchD_001313c3_caseD_113;
  case 0x115:
    uVar4 = 0;
    break;
  case 0x116:
    uVar4 = 4;
    break;
  case 0x117:
    uVar4 = 3;
    break;
  case 0x11d:
    uVar4 = 5;
    break;
  default:
    if (iVar2 == 0x106) goto switchD_001313c3_caseD_112;
    uVar4 = 1;
    if (iVar2 != 0x10c) goto switchD_001313c3_caseD_113;
  }
  *(undefined4 *)((long)data + 4) = uVar4;
switchD_001313c3_caseD_113:
  if (iVar2 == 0x115) {
    LVar3 = SearchName(this,(term->token_).field_0.str_);
    term->scoping_ = LVar3;
  }
  if ((term->token_).token_ == 0x11d) {
    if (this->current_function_->has_vararg == false) {
      this_00 = (SemanticException *)__cxa_allocate_exception(0x20);
      SemanticException::SemanticException(this_00,"function has no \'...\' param",&term->token_);
      __cxa_throw(this_00,&SemanticException::typeinfo,Exception::~Exception);
    }
    *(undefined1 *)((long)data + 8) = 1;
  }
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(Terminator *term, void *data)
    {
        // Current term read and write semantic
        auto exp_var_data = static_cast<ExpVarData *>(data);
        term->semantic_ = exp_var_data->semantic_op_;
        if (term->token_.token_ != Token_Id)
            assert(exp_var_data->semantic_op_ == SemanticOp_Read);

        // Set Expression type
        switch (term->token_.token_)
        {
            case Token_Nil: exp_var_data->exp_type_ = ExpType_Nil; break;
            case Token_Id: exp_var_data->exp_type_ = ExpType_Unknown; break;
            case Token_Number: exp_var_data->exp_type_ = ExpType_Number; break;
            case Token_String: exp_var_data->exp_type_ = ExpType_String; break;
            case Token_VarArg: exp_var_data->exp_type_ = ExpType_VarArg; break;
            case Token_True: case Token_False: exp_var_data->exp_type_ = ExpType_Bool; break;
        }

        // Search lexical scoping of name
        if (term->token_.token_ == Token_Id)
            term->scoping_ = SearchName(term->token_.str_);

        // Check function has vararg
        if (term->token_.token_ == Token_VarArg && !HasVararg())
            throw SemanticException("function has no '...' param", term->token_);

        // Set results any count
        if (term->token_.token_ == Token_VarArg)
            exp_var_data->results_any_count_ = true;
    }